

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

padding_info __thiscall
spdlog::pattern_formatter::handle_padspec_
          (pattern_formatter *this,const_iterator *it,const_iterator end)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  reference pcVar4;
  byte *pbVar5;
  unsigned_long *puVar6;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  bool truncate;
  size_t digit;
  size_t width;
  pad_side side;
  size_t max_width;
  uint7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  byte bVar7;
  unsigned_long local_40;
  pad_side local_34;
  unsigned_long local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  padding_info local_10;
  
  local_30 = 0x40;
  local_28 = in_RSI;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  if (bVar1) {
    memset(&local_10,0,0x10);
    details::padding_info::padding_info(&local_10);
  }
  else {
    pcVar4 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(local_28);
    iVar2 = (int)*pcVar4;
    if (iVar2 == 0x2d) {
      local_34 = right;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_28);
    }
    else if (iVar2 == 0x3d) {
      local_34 = center;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_28);
    }
    else {
      local_34 = left;
    }
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
    if (!bVar1) {
      pbVar5 = (byte *)__gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(local_28);
      iVar3 = isdigit((uint)*pbVar5);
      if (iVar3 != 0) {
        pcVar4 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(local_28);
        local_40 = (long)*pcVar4 - 0x30;
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(local_28);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
          in_stack_ffffffffffffffaf = false;
          if (bVar1) {
            pbVar5 = (byte *)__gnu_cxx::
                             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             ::operator*(local_28);
            iVar3 = isdigit((uint)*pbVar5);
            in_stack_ffffffffffffffaf = iVar3 != 0;
          }
          if ((bool)in_stack_ffffffffffffffaf == false) break;
          pcVar4 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(local_28);
          local_40 = local_40 * 10 + (long)*pcVar4 + -0x30;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(local_28);
        }
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT44(in_stack_ffffffffffffffb4,iVar2),
                           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(ulong)in_stack_ffffffffffffffa8);
        if ((bVar1) &&
           (pcVar4 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(local_28), *pcVar4 == '!')) {
          bVar7 = 1;
          __gnu_cxx::
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(local_28);
        }
        else {
          bVar7 = 0;
        }
        puVar6 = std::min<unsigned_long>(&local_40,&local_30);
        details::padding_info::padding_info(&local_10,*puVar6,local_34,(bool)(bVar7 & 1));
        return local_10;
      }
    }
    memset(&local_10,0,0x10);
    details::padding_info::padding_info(&local_10);
  }
  return local_10;
}

Assistant:

SPDLOG_INLINE details::padding_info pattern_formatter::handle_padspec_(std::string::const_iterator &it, std::string::const_iterator end)
{
    using details::padding_info;
    using details::scoped_padder;
    const size_t max_width = 64;
    if (it == end)
    {
        return padding_info{};
    }

    padding_info::pad_side side;
    switch (*it)
    {
    case '-':
        side = padding_info::right;
        ++it;
        break;
    case '=':
        side = padding_info::center;
        ++it;
        break;
    default:
        side = details::padding_info::left;
        break;
    }

    if (it == end || !std::isdigit(static_cast<unsigned char>(*it)))
    {
        return padding_info{}; // no padding if no digit found here
    }

    auto width = static_cast<size_t>(*it) - '0';
    for (++it; it != end && std::isdigit(static_cast<unsigned char>(*it)); ++it)
    {
        auto digit = static_cast<size_t>(*it) - '0';
        width = width * 10 + digit;
    }

    // search for the optional truncate marker '!'
    bool truncate;
    if (it != end && *it == '!')
    {
        truncate = true;
        ++it;
    }
    else
    {
        truncate = false;
    }

    return details::padding_info{std::min<size_t>(width, max_width), side, truncate};
}